

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void setShiftPermute(int s)

{
  bool bVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int ss [6];
  
  piVar2 = permute;
  lVar5 = 1;
  ss[0] = 0;
  do {
    next = next * 0x41c64e6d + 0x3039;
    ss[lVar5] = ((uint)(next >> 0x10) & 0x7fff) % 200;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  uVar7 = (ulong)(uint)numOfVariables;
  if (0 < numOfVariables) {
    uVar6 = 0;
    do {
      piVar2[uVar6 + 1] =
           (groupSize *
            ss[(int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                    (long)groupSize)] + (int)uVar6) % (int)uVar7 + 1;
      piVar4 = unpermute;
      piVar3 = permute;
      uVar6 = uVar6 + 1;
      uVar7 = (ulong)numOfVariables;
    } while ((long)uVar6 < (long)uVar7);
    if (0 < numOfVariables) {
      lVar5 = 1;
      do {
        piVar4[piVar3[lVar5]] = (int)lVar5;
        bVar1 = lVar5 < numOfVariables;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void setShiftPermute (int s)
{
	int v;
	int ss[6];
	ss[0] = 0;
	for (v=1;v<=5;v++)
		ss[v] = myrand()%200;



	for (v=1;v<=numOfVariables;v++)
		permute[v] = 1 + (v-1+groupSize*ss[(v-1)%groupSize] )%numOfVariables;

	for (v=1;v<=numOfVariables;v++)
		unpermute[permute[v]] = v;

}